

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

_Bool spell_cast(wchar_t spell_index,wchar_t dir,command *cmd)

{
  uint32_t *puVar1;
  byte bVar2;
  short sVar3;
  effect *effect;
  _Bool _Var4;
  int16_t iVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  class_spell_conflict *pcVar8;
  char *dice_string;
  int iVar9;
  wchar_t wVar10;
  player *p;
  int iVar11;
  source sVar12;
  source sVar13;
  _Bool ident;
  int local_48;
  wchar_t local_44;
  class_spell_conflict *local_40;
  command *local_38;
  
  ident = false;
  wVar10 = (wchar_t)player->lev;
  local_44 = dir;
  local_38 = cmd;
  _Var4 = flag_has_dbg((player->state).pflags,10,0x44,"player->state.pflags","(PF_HEIGHTEN_MAGIC)");
  if (_Var4) {
    wVar10 = wVar10 + (player->heighten_power + 5) / 10 + L'\x01';
  }
  _Var4 = flag_has_dbg((player->state).pflags,10,0x47,"player->state.pflags","(PF_CHANNELING)");
  if (_Var4) {
    wVar6 = player_get_channeling_boost(player);
    wVar10 = wVar6 + wVar10;
  }
  _Var4 = flag_has_dbg((player->state).pflags,10,0x1b,"player->state.pflags","(PF_BEAM)");
  pcVar8 = spell_by_index(player,spell_index);
  iVar5 = spell_chance(spell_index);
  iVar11 = (int)iVar5;
  uVar7 = Rand_div(100);
  local_48 = iVar11;
  if ((int)uVar7 < iVar11) {
    event_signal(EVENT_INPUT_FLUSH);
    msg("You failed to concentrate hard enough!");
    p = player;
  }
  else {
    wVar6 = wVar10 / 2;
    if (_Var4) {
      wVar6 = wVar10;
    }
    effect = pcVar8->effect;
    local_40 = pcVar8;
    sVar12 = source_player();
    sVar13.which = sVar12.which;
    sVar13._4_4_ = 0;
    sVar13.what = sVar12.what;
    _Var4 = effect_do(effect,sVar13,(object *)0x0,&ident,true,local_44,wVar6,L'\0',local_38);
    if (!_Var4) {
      return false;
    }
    _Var4 = flag_has_dbg((player->state).pflags,10,0x23,"player->state.pflags","(PF_COMBAT_REGEN)");
    pcVar8 = local_40;
    if (_Var4) {
      convert_mana_to_hp(player,local_40->smana << 0x10);
    }
    sound(0x95);
    bVar2 = player->spell_flags[spell_index];
    p = player;
    if ((bVar2 & 2) == 0) {
      iVar11 = pcVar8->sexp;
      player->spell_flags[spell_index] = bVar2 | 2;
      player_exp_gain(player,iVar11 * pcVar8->slevel);
      p = player;
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x200000;
    }
  }
  iVar11 = pcVar8->smana;
  sVar3 = p->csp;
  iVar9 = iVar11 - sVar3;
  if (iVar9 == 0 || iVar11 < sVar3) {
    p->csp = sVar3 - (short)iVar11;
    if ((local_48 <= (int)uVar7) &&
       (_Var4 = flag_has_dbg((p->state).pflags,10,0x46,"player->state.pflags","(PF_HARMONY)"), _Var4
       )) {
      if (pcVar8->smana < 0x15) {
        iVar11 = pcVar8->smana / 3 + 3;
      }
      else {
        iVar11 = 10;
      }
      sVar3 = player->mhp;
      sVar13 = source_player();
      sVar12.which = sVar13.which;
      dice_string = format("%d",(long)(sVar3 * iVar11) / 100 & 0xffffffff);
      sVar12._4_4_ = 0;
      sVar12.what = sVar13.what;
      effect_simple(L'\x03',sVar12,dice_string,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    }
  }
  else {
    p->csp = 0;
    p->csp_frac = 0;
    player_over_exert(p,L'\x02',L'd',iVar9 * 5 + L'\x01');
    player_over_exert(player,L'\x01',L'2',L'\0');
  }
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x80;
  return true;
}

Assistant:

bool spell_cast(int spell_index, int dir, struct command *cmd)
{
	int chance;
	bool ident = false;
	int beam  = beam_chance();
	bool failed = false;

	/* Get the spell */
	const struct class_spell *spell = spell_by_index(player, spell_index);

	/* Spell failure chance */
	chance = spell_chance(spell_index);

	/* Fail or succeed */
	if (randint0(100) < chance) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to concentrate hard enough!");
		failed = true;
	} else {
		/* Cast the spell */
		if (!effect_do(spell->effect, source_player(), NULL, &ident, true, dir,
					   beam, 0, cmd)) {
			return false;
		}

		/* Reward COMBAT_REGEN with small HP recovery */
		if (player_has(player, PF_COMBAT_REGEN)) {
			convert_mana_to_hp(player, spell->smana << 16);
		}

		/* A spell was cast */
		sound(MSG_SPELL);

		if (!(player->spell_flags[spell_index] & PY_SPELL_WORKED)) {
			int e = spell->sexp;

			/* The spell worked */
			player->spell_flags[spell_index] |= PY_SPELL_WORKED;

			/* Gain experience */
			player_exp_gain(player, e * spell->slevel);

			/* Redraw object recall */
			player->upkeep->redraw |= (PR_OBJECT);
		}
	}

	/* Sufficient mana? */
	if (spell->smana <= player->csp) {
		/* Use some mana */
		player->csp -= spell->smana;

		/* Specialty ability Harmony */
		if (!failed && player_has(player, PF_HARMONY)) {
			/* Percentage of max hp to be regained, capped at 10% */
			int frac = MIN(10, 3 + (spell->smana / 3));

			/* Calculate fractional bonus */
			int boost = (frac * player->mhp) / 100;

			/* Apply bonus */
			effect_simple(EF_HEAL_HP, source_player(), format("%d", boost), 0,
						  0, 0, 0, 0, NULL);
		}
	} else {
		int oops = spell->smana - player->csp;

		/* No mana left */
		player->csp = 0;
		player->csp_frac = 0;

		/* Over-exert the player */
		player_over_exert(player, PY_EXERT_FAINT, 100, 5 * oops + 1);
		player_over_exert(player, PY_EXERT_CON, 50, 0);
	}

	/* Redraw mana */
	player->upkeep->redraw |= (PR_MANA);

	return true;
}